

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINGetNumNonlinSolvIters(void *kinmem,long *nniters)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINGetNumNonlinSolvIters","kinsol_mem = NULL illegal.")
    ;
  }
  else {
    *nniters = *(long *)((long)kinmem + 200);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetNumNonlinSolvIters(void *kinmem, long int *nniters)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINGetNumNonlinSolvIters", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  *nniters = nni;

  return(KIN_SUCCESS);
}